

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

void __thiscall
HighsSimplexAnalysis::setupFactorTime(HighsSimplexAnalysis *this,HighsOptions *options)

{
  HighsTimerClock *pHVar1;
  uint uVar2;
  long *plVar3;
  int iVar4;
  iterator __begin2;
  HighsTimerClock *factor_timer_clock;
  FactorTimer factor_timer;
  value_type local_48;
  
  uVar2 = (options->super_HighsOptionsStruct).highs_analysis_level & 0x20;
  this->analyse_factor_time = SUB41(uVar2 >> 5,0);
  if (uVar2 == 0) {
    this->pointer_serial_factor_clocks = (HighsTimerClock *)0x0;
  }
  else {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar3 = (long *)__tls_get_addr(&PTR_00441ef0);
    iVar4 = *(int *)(*plVar3 + 0x28);
    std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::clear
              (&this->thread_factor_clocks);
    if (0 < iVar4) {
      do {
        local_48.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.timer_pointer_ = this->timer_;
        std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::push_back
                  (&this->thread_factor_clocks,&local_48);
        if (local_48.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    factor_timer_clock =
         (this->thread_factor_clocks).
         super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
         super__Vector_impl_data._M_start;
    this->pointer_serial_factor_clocks = factor_timer_clock;
    pHVar1 = (this->thread_factor_clocks).
             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (; factor_timer_clock != pHVar1; factor_timer_clock = factor_timer_clock + 1) {
      FactorTimer::initialiseFactorClocks((FactorTimer *)&local_48,factor_timer_clock);
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::setupFactorTime(const HighsOptions& options) {
  analyse_factor_time =
      kHighsAnalysisLevelNlaTime & options.highs_analysis_level;
  if (analyse_factor_time) {
    // Set up the thread clocks
    HighsInt max_threads = highs::parallel::num_threads();
    thread_factor_clocks.clear();
    for (HighsInt i = 0; i < max_threads; i++) {
      HighsTimerClock clock;
      clock.timer_pointer_ = timer_;
      thread_factor_clocks.push_back(clock);
    }
    pointer_serial_factor_clocks = thread_factor_clocks.data();
    FactorTimer factor_timer;
    for (HighsTimerClock& clock : thread_factor_clocks)
      factor_timer.initialiseFactorClocks(clock);
  } else {
    pointer_serial_factor_clocks = NULL;
  }
}